

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

void __thiscall OpenSSLWrapper::SslConnection::SslConnection(SslConnection *this,SslContext *ctx)

{
  SSL_CTX *ctx_00;
  SSL *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  
  ctx_00 = (SSL_CTX *)SslContext::operator()(ctx);
  pSVar1 = SSL_new(ctx_00);
  this->m_ssl = (SSL *)pSVar1;
  this->m_iShutDownFlag = -0x80000000;
  this->m_bZeroReceived = false;
  (this->m_mxSsl).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxSsl).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxSsl).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxSsl).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mxSsl).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->m_fError).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fError).super__Function_base._M_functor + 8) = 0;
  (this->m_fError).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fError)._M_invoker = (_Invoker_type)0x0;
  this->m_iWantState = 0;
  pBVar2 = BIO_s_mem();
  pBVar3 = BIO_new(pBVar2);
  this->m_rbio = (BIO *)pBVar3;
  pBVar2 = BIO_s_mem();
  pBVar3 = BIO_new(pBVar2);
  this->m_wbio = (BIO *)pBVar3;
  BIO_ctrl((BIO *)this->m_rbio,0x82,-1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_wbio,0x82,-1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_rbio,0x66,1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_wbio,0x66,1,(void *)0x0);
  SSL_set_bio((SSL *)this->m_ssl,(BIO *)this->m_wbio,(BIO *)this->m_rbio);
  return;
}

Assistant:

SslConnection::SslConnection(SslContext& ctx) : m_ssl(SSL_new(ctx())), m_iShutDownFlag(INT32_MIN), m_bZeroReceived(false), m_iWantState(0)
    {
        m_rbio = BIO_new(BIO_s_mem());
        m_wbio = BIO_new(BIO_s_mem());
        BIO_set_mem_eof_return(m_rbio, -1);
        BIO_set_mem_eof_return(m_wbio, -1);
        BIO_set_nbio(m_rbio, 1);    // make the bio non blocking
        BIO_set_nbio(m_wbio, 1);    // make the bio non blocking
        SSL_set_bio(m_ssl, m_wbio, m_rbio);

        //BIO_set_callback_arg(m_rbio, (char*)this);
        //BIO_set_callback_arg(m_wbio, (char*)this);
        //BIO_set_callback(m_rbio, CbBioInfo);
        //BIO_set_callback(m_wbio, CbBioInfo);
    }